

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O2

int asn1_template_noexp_d2i
              (ASN1_VALUE **val,uchar **in,long len,ASN1_TEMPLATE *tt,char opt,CRYPTO_BUFFER *buf,
              int depth)

{
  uint uVar1;
  uchar *puVar2;
  uint aclass;
  size_t sVar3;
  OPENSSL_STACK *pOVar4;
  int iVar5;
  stack_st_ASN1_VALUE *sktmp;
  uchar *p;
  ASN1_VALUE *vtmp;
  uchar **local_40;
  long len_local;
  
  uVar1 = tt->flags;
  aclass = uVar1 & 0xc0;
  p = *in;
  local_40 = in;
  len_local = len;
  if ((uVar1 & 6) == 0) {
    if ((uVar1 & 8) == 0) {
      iVar5 = asn1_item_ex_d2i(val,&p,len,tt->item,-1,0,opt,buf,depth);
      if (iVar5 == -1) {
        return -1;
      }
      if (iVar5 != 0) {
LAB_001f3d85:
        *local_40 = p;
        return 1;
      }
      iVar5 = 600;
    }
    else {
      iVar5 = asn1_item_ex_d2i(val,&p,len,tt->item,tt->tag,aclass,opt,buf,depth);
      if (iVar5 == -1) {
        return -1;
      }
      if (iVar5 != 0) goto LAB_001f3d85;
      iVar5 = 0x24e;
    }
LAB_001f3dae:
    ERR_put_error(0xc,0,0x9e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,iVar5);
  }
  else {
    if ((uVar1 & 8) == 0) {
      iVar5 = 0x11 - (uint)((uVar1 & 2) == 0);
      aclass = 0;
    }
    else {
      iVar5 = tt->tag;
    }
    iVar5 = asn1_check_tlen(&len_local,(int *)0x0,(uchar *)0x0,(char *)0x0,&p,len,iVar5,aclass,opt);
    if (iVar5 == -1) {
      return -1;
    }
    if (iVar5 == 0) {
      ERR_put_error(0xc,0,0x9e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x224);
      return 0;
    }
    pOVar4 = (OPENSSL_STACK *)*val;
    if (pOVar4 == (OPENSSL_STACK *)0x0) {
      pOVar4 = OPENSSL_sk_new_null();
      *val = (ASN1_VALUE *)pOVar4;
    }
    else {
      while (sVar3 = OPENSSL_sk_num(pOVar4), sVar3 != 0) {
        vtmp = (ASN1_VALUE *)OPENSSL_sk_pop(pOVar4);
        ASN1_item_ex_free((ASN1_VALUE **)&vtmp,(ASN1_ITEM *)tt->item);
      }
      pOVar4 = (OPENSSL_STACK *)*val;
    }
    if (pOVar4 != (OPENSSL_STACK *)0x0) {
      do {
        puVar2 = p;
        if (len_local < 1) goto LAB_001f3d85;
        vtmp = (ASN1_VALUE *)0x0;
        iVar5 = asn1_item_ex_d2i(&vtmp,&p,len_local,tt->item,-1,0,'\0',buf,depth);
        if (iVar5 == 0) {
          iVar5 = 0x240;
          goto LAB_001f3dae;
        }
        len_local = (long)(puVar2 + (len_local - (long)p));
        sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)*val,vtmp);
      } while (sVar3 != 0);
      ASN1_item_ex_free((ASN1_VALUE **)&vtmp,(ASN1_ITEM *)tt->item);
    }
  }
  ASN1_template_free((ASN1_VALUE **)val,(ASN1_TEMPLATE *)tt);
  return 0;
}

Assistant:

static int asn1_template_noexp_d2i(ASN1_VALUE **val, const unsigned char **in,
                                   long len, const ASN1_TEMPLATE *tt, char opt,
                                   CRYPTO_BUFFER *buf, int depth) {
  int aclass;
  int ret;
  const unsigned char *p;
  if (!val) {
    return 0;
  }
  uint32_t flags = tt->flags;
  aclass = flags & ASN1_TFLG_TAG_CLASS;

  p = *in;

  if (flags & ASN1_TFLG_SK_MASK) {
    // SET OF, SEQUENCE OF
    int sktag, skaclass;
    // First work out expected inner tag value
    if (flags & ASN1_TFLG_IMPTAG) {
      sktag = tt->tag;
      skaclass = aclass;
    } else {
      skaclass = V_ASN1_UNIVERSAL;
      if (flags & ASN1_TFLG_SET_OF) {
        sktag = V_ASN1_SET;
      } else {
        sktag = V_ASN1_SEQUENCE;
      }
    }
    // Get the tag
    ret =
        asn1_check_tlen(&len, NULL, NULL, NULL, &p, len, sktag, skaclass, opt);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    } else if (ret == -1) {
      return -1;
    }
    if (!*val) {
      *val = (ASN1_VALUE *)sk_ASN1_VALUE_new_null();
    } else {
      // We've got a valid STACK: free up any items present
      STACK_OF(ASN1_VALUE) *sktmp = (STACK_OF(ASN1_VALUE) *)*val;
      ASN1_VALUE *vtmp;
      while (sk_ASN1_VALUE_num(sktmp) > 0) {
        vtmp = sk_ASN1_VALUE_pop(sktmp);
        ASN1_item_ex_free(&vtmp, ASN1_ITEM_ptr(tt->item));
      }
    }

    if (!*val) {
      goto err;
    }

    // Read as many items as we can
    while (len > 0) {
      ASN1_VALUE *skfield;
      const unsigned char *q = p;
      skfield = NULL;
      if (!asn1_item_ex_d2i(&skfield, &p, len, ASN1_ITEM_ptr(tt->item),
                            /*tag=*/-1, /*aclass=*/0, /*opt=*/0, buf, depth)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }
      len -= p - q;
      if (!sk_ASN1_VALUE_push((STACK_OF(ASN1_VALUE) *)*val, skfield)) {
        ASN1_item_ex_free(&skfield, ASN1_ITEM_ptr(tt->item));
        goto err;
      }
    }
  } else if (flags & ASN1_TFLG_IMPTAG) {
    // IMPLICIT tagging
    ret = asn1_item_ex_d2i(val, &p, len, ASN1_ITEM_ptr(tt->item), tt->tag,
                           aclass, opt, buf, depth);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      goto err;
    } else if (ret == -1) {
      return -1;
    }
  } else {
    // Nothing special
    ret = asn1_item_ex_d2i(val, &p, len, ASN1_ITEM_ptr(tt->item), /*tag=*/-1,
                           /*aclass=*/0, opt, buf, depth);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      goto err;
    } else if (ret == -1) {
      return -1;
    }
  }

  *in = p;
  return 1;

err:
  ASN1_template_free(val, tt);
  return 0;
}